

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classic.cpp
# Opt level: O3

bool __thiscall ClassicMapGenerator::generate(ClassicMapGenerator *this)

{
  undefined8 uVar1;
  coord cVar2;
  coord cVar3;
  pointer pAVar4;
  int iVar5;
  long lVar6;
  Area local_34;
  
  do_rooms(this);
  lVar6 = 0;
  do {
    if ((*(byte *)((long)(this->rooms[0].r_exit + -1) + lVar6) & 2) == 0) {
      Area::Area(&local_34);
      pAVar4 = areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.super__Vector_impl_data
               ._M_finish;
      uVar1 = *(undefined8 *)((long)this->rooms[0].r_exit + lVar6 + -0x1c);
      local_34.position.x = (int)uVar1 + 1;
      local_34.position.y = (int)((ulong)uVar1 >> 0x20) + 1;
      uVar1 = *(undefined8 *)((long)this->rooms[0].r_exit + lVar6 + -0x14);
      local_34.size.x = (int)uVar1 + -2;
      local_34.size.y = (int)((ulong)uVar1 >> 0x20) + -2;
      if (areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<Area,std::allocator<Area>>::_M_realloc_insert<Area_const&>
                  ((vector<Area,std::allocator<Area>> *)&areas,
                   (iterator)
                   areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_34);
      }
      else {
        (areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.super__Vector_impl_data.
        _M_finish)->flags = local_34.flags;
        cVar2.y = local_34.position.y;
        cVar2.x = local_34.position.x;
        cVar3.y = local_34.size.y;
        cVar3.x = local_34.size.x;
        pAVar4->position = cVar2;
        pAVar4->size = cVar3;
        areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.super__Vector_impl_data.
        _M_finish = areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    lVar6 = lVar6 + 0x7c;
  } while (lVar6 != 0x45c);
  do_passages(this);
  if ((amulet == false) && (level == max_level)) {
    iVar5 = rnd(0x14);
    if (iVar5 == 0) {
      treas_room(this);
    }
  }
  placeRandomItems();
  placeAmuletIfRequired();
  placeRandomTraps();
  placeRandomStairs();
  placeRandomHero();
  return true;
}

Assistant:

bool ClassicMapGenerator::generate()
{
    do_rooms();     /* Draw rooms */
    //Build the area definitions from the room definitions.
    for(int n=0; n<MAXROOMS; n++)
    {
        if (rooms[n].r_flags & ISGONE)
            continue;
        Area area;
        area.position = rooms[n].r_pos;
        area.position.x += 1;
        area.position.y += 1;
        area.size = rooms[n].r_max;
        area.size.x -= 2;
        area.size.y -= 2;
        areas.push_back(area);
    }
    do_passages();  /* Draw passages */

    /*
     * check for treasure rooms, and if so, put it in.
     */
    if (!amulet && level == max_level && rnd(TREAS_ROOM) == 0)
        treas_room();

    placeRandomItems();
    placeAmuletIfRequired();
    placeRandomTraps();
    placeRandomStairs();
    placeRandomHero();
    
    return true;
}